

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O2

bool __thiscall
FIX::Session::isCorrectCompID(Session *this,SenderCompID *senderCompID,TargetCompID *targetCompID)

{
  __type_conflict1 _Var1;
  bool bVar2;
  
  bVar2 = true;
  if (this->m_checkCompId == true) {
    _Var1 = std::operator==(&(this->m_sessionID).m_senderCompID.super_StringField.super_FieldBase.
                             m_string,&(targetCompID->super_StringField).super_FieldBase.m_string);
    if (_Var1) {
      _Var1 = std::operator==(&(this->m_sessionID).m_targetCompID.super_StringField.super_FieldBase.
                               m_string,&(senderCompID->super_StringField).super_FieldBase.m_string)
      ;
      return _Var1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool isCorrectCompID(const SenderCompID &senderCompID, const TargetCompID &targetCompID) {
    if (!m_checkCompId) {
      return true;
    }

    return m_sessionID.getSenderCompID().getValue() == targetCompID.getValue()
           && m_sessionID.getTargetCompID().getValue() == senderCompID.getValue();
  }